

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O3

Vector3d * __thiscall OpenMD::Snapshot::getHeatFlux(Snapshot *this)

{
  uint i;
  long lVar1;
  Vector3d *in_RDI;
  Vector<double,_3U> result;
  double local_38 [4];
  double local_18 [3];
  
  local_18[2] = (this->frameData).conductiveHeatFlux.super_Vector<double,_3U>.data_[2];
  local_18[0] = (this->frameData).conductiveHeatFlux.super_Vector<double,_3U>.data_[0];
  local_18[1] = (this->frameData).conductiveHeatFlux.super_Vector<double,_3U>.data_[1];
  local_38[2] = (this->frameData).convectiveHeatFlux.super_Vector<double,_3U>.data_[2];
  local_38[0] = (this->frameData).convectiveHeatFlux.super_Vector<double,_3U>.data_[0];
  local_38[1] = (this->frameData).convectiveHeatFlux.super_Vector<double,_3U>.data_[1];
  result.data_[0] = 0.0;
  result.data_[1] = 0.0;
  result.data_[2] = 0.0;
  lVar1 = 0;
  do {
    result.data_[lVar1] = local_18[lVar1] + local_38[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  (in_RDI->super_Vector<double,_3U>).data_[2] = result.data_[2];
  (in_RDI->super_Vector<double,_3U>).data_[0] = result.data_[0];
  (in_RDI->super_Vector<double,_3U>).data_[1] = result.data_[1];
  return in_RDI;
}

Assistant:

Vector3d Snapshot::getHeatFlux() {
    // BE CAREFUL WITH UNITS
    return getConductiveHeatFlux() + getConvectiveHeatFlux();
  }